

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> *
rcg::System::getSystems(void)

{
  long lVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  reference pvVar5;
  ostream *poVar6;
  undefined8 uVar7;
  vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> *in_RDI;
  char *in_stack_00000028;
  exception *ex;
  System *p;
  int k;
  size_t i;
  ostringstream info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name;
  char *env;
  lock_guard<std::recursive_mutex> lock;
  vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> *ret;
  System *in_stack_fffffffffffffd58;
  string *in_stack_fffffffffffffd60;
  vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
  *in_stack_fffffffffffffd68;
  System *in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  byte in_stack_fffffffffffffd7f;
  GenTLException *in_stack_fffffffffffffd80;
  byte local_25d;
  string *in_stack_fffffffffffffdf8;
  System *in_stack_fffffffffffffe00;
  string local_1f0 [36];
  int local_1cc;
  ulong local_1c8;
  ostringstream local_1c0 [376];
  GenTLException local_48;
  char *local_20;
  byte local_11;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffd60,
             (mutex_type *)in_stack_fffffffffffffd58);
  local_11 = 0;
  std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::vector
            ((vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> *
             )0x10e8e2);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    local_20 = "GENICAM_GENTL64_PATH";
    getenv("GENICAM_GENTL64_PATH");
    setSystemsPath((char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                   (char *)in_stack_fffffffffffffd70);
  }
  std::__cxx11::string::c_str();
  getAvailableGenTLs_abi_cxx11_(in_stack_00000028);
  std::__cxx11::ostringstream::ostringstream(local_1c0);
  local_1c8 = 0;
  do {
    uVar3 = local_1c8;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_48);
    if (sVar2 <= uVar3) {
      std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
      operator=((vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                 *)in_stack_fffffffffffffe00,
                (vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                 *)in_stack_fffffffffffffdf8);
      sVar2 = std::
              vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
              size(in_RDI);
      if (sVar2 == 0) {
        poVar6 = std::operator<<((ostream *)local_1c0,"No transport layers found in path: ");
        std::operator<<(poVar6,(string *)(anonymous_namespace)::system_path_abi_cxx11_);
        uVar7 = __cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        GenTLException::GenTLException
                  (in_stack_fffffffffffffd80,
                   (string *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
        __cxa_throw(uVar7,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      local_11 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffd70);
      if ((local_11 & 1) == 0) {
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        ~vector((vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                 *)in_stack_fffffffffffffd70);
      }
      std::lock_guard<std::recursive_mutex>::~lock_guard
                ((lock_guard<std::recursive_mutex> *)0x10ee3a);
      return in_RDI;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_48,local_1c8);
    local_1cc = anon_unknown_0::find(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    lVar1 = std::__cxx11::string::size();
    local_25d = in_stack_fffffffffffffd7f;
    if (lVar1 == 0) {
LAB_0010eb32:
      if (local_1cc < 0) {
        in_stack_fffffffffffffd70 = (System *)operator_new(0xb0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,local_1c8);
        System(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        in_stack_fffffffffffffe00 = in_stack_fffffffffffffd70;
        std::shared_ptr<rcg::System>::shared_ptr<rcg::System,void>
                  ((shared_ptr<rcg::System> *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        push_back((vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                   *)in_stack_fffffffffffffd60,(value_type *)in_stack_fffffffffffffd58);
        std::shared_ptr<rcg::System>::~shared_ptr((shared_ptr<rcg::System> *)0x10ebde);
      }
      else {
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        operator[]((vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                    *)(anonymous_namespace)::system_list,(long)local_1cc);
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        push_back((vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                   *)in_stack_fffffffffffffd70,(value_type *)in_stack_fffffffffffffd68);
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_48,local_1c8);
      uVar3 = std::__cxx11::string::size();
      uVar4 = std::__cxx11::string::size();
      local_25d = 0;
      if (uVar4 <= uVar3) {
        in_stack_fffffffffffffd80 = &local_48;
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffffd80,local_1c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffd80,local_1c8);
        std::__cxx11::string::size();
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_1f0,(ulong)pvVar5);
        local_25d = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffd80,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78)
                                   );
        std::__cxx11::string::~string(local_1f0);
      }
      if ((local_25d & 1) == 0) goto LAB_0010eb32;
    }
    local_1c8 = local_1c8 + 1;
    in_stack_fffffffffffffd7f = local_25d;
  } while( true );
}

Assistant:

std::vector<std::shared_ptr<System> > System::getSystems()
{
  std::lock_guard<std::recursive_mutex> lock(system_mtx);
  std::vector<std::shared_ptr<System> > ret;

  // ensure that system_path is defined

  if (system_path.size() == 0)
  {
    const char *env=0;
    if (sizeof(size_t) == 8)
    {
      env="GENICAM_GENTL64_PATH";
    }
    else
    {
      env="GENICAM_GENTL32_PATH";
    }

    setSystemsPath(std::getenv(env), 0);
  }

  // get list of all available transport layer libraries

  std::vector<std::string> name=getAvailableGenTLs(system_path.c_str());
  std::ostringstream info;

  // create list of systems according to the list, using either existing
  // systems or instantiating new ones

  for (size_t i=0; i<name.size(); i++)
  {
    int k=find(system_list, name[i]);

    if (system_ignore.size() > 0)
    {
      // skipping if name equals ignore

      if (name[i].size() >= system_ignore.size() &&
          name[i].substr(name[i].size()-system_ignore.size()) == system_ignore)
      {
        continue;
      }
    }

    if (k >= 0)
    {
      ret.push_back(system_list[static_cast<size_t>(k)]);
    }
    else
    {
      try
      {
        System *p=new System(name[i]);
        ret.push_back(std::shared_ptr<System>(p));
      }
      catch (const std::exception &ex)
      {
        // ignore transport layers that cannot be used, but collect reason
        // for failure

        info << ex.what() << std::endl;
      }
    }
  }

  // remember returned list for reusing existing systems on the next call

  system_list=ret;

  // throw exception if no transport layers are available

  if (ret.size() == 0)
  {
    info << "No transport layers found in path: " << system_path;
    throw GenTLException(info.str());
  }

  return ret;
}